

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *format,char *format_max,float power)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  long in_RCX;
  float *in_RDX;
  float *in_RSI;
  char *in_RDI;
  long in_R8;
  float fVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  float in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  bool local_1;
  
  fVar3 = (float)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    PushID((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    BeginGroup();
    CalcItemWidth();
    PushMultiItemsWidths
              ((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),SUB84(in_stack_ffffffffffffff80,0));
    if (in_XMM1_Da < in_XMM2_Da) {
      ImMin<float>(in_XMM2_Da,*in_RDX);
    }
    local_1 = DragFloat(in_stack_ffffffffffffff80,
                        (float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,fVar3,
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    PopItemWidth();
    SameLine((float)((ulong)in_stack_ffffffffffffff60 >> 0x20),SUB84(in_stack_ffffffffffffff60,0));
    if (in_XMM1_Da < in_XMM2_Da) {
      fVar3 = ImMax<float>(in_XMM1_Da,*in_RSI);
    }
    else {
      fVar3 = *in_RSI;
      in_XMM2_Da = 3.4028235e+38;
    }
    if (in_R8 != 0) {
      in_RCX = in_R8;
    }
    bVar1 = DragFloat((char *)in_RDX,(float *)CONCAT44(fVar3,fVar3),in_XMM2_Da,in_XMM2_Da,
                      (float)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
    local_1 = local_1 || bVar1;
    PopItemWidth();
    SameLine((float)((ulong)in_stack_ffffffffffffff60 >> 0x20),SUB84(in_stack_ffffffffffffff60,0));
    FindRenderedTextEnd(in_RDI,(char *)0x0);
    TextEx((char *)v_current_min,(char *)v_current_max,(ImGuiTextFlags)v_speed);
    EndGroup();
    PopID();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    bool value_changed = DragFloat("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragFloat("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? FLT_MAX : v_max, format_max ? format_max : format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();
    return value_changed;
}